

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimerinfo_unix.cpp
# Opt level: O3

QList<QAbstractEventDispatcher::TimerInfoV2> * __thiscall
QTimerInfoList::registeredTimers
          (QList<QAbstractEventDispatcher::TimerInfoV2> *__return_storage_ptr__,QTimerInfoList *this
          ,QObject *object)

{
  long lVar1;
  QTimerInfo **ppQVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  TimerInfoV2 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (TimerInfoV2 *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar1 = (this->timers).d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->timers).d.ptr;
    lVar4 = 0;
    do {
      lVar3 = *(long *)((long)ppQVar2 + lVar4);
      if (*(QObject **)(lVar3 + 0x18) == object) {
        local_48.interval.__r = *(rep *)(lVar3 + 8);
        local_48._8_8_ = *(undefined8 *)(lVar3 + 0x10);
        QtPrivate::QPodArrayOps<QAbstractEventDispatcher::TimerInfoV2>::
        emplace<QAbstractEventDispatcher::TimerInfoV2>
                  ((QPodArrayOps<QAbstractEventDispatcher::TimerInfoV2> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_48);
        QList<QAbstractEventDispatcher::TimerInfoV2>::end(__return_storage_ptr__);
      }
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

auto QTimerInfoList::registeredTimers(QObject *object) const -> QList<TimerInfo>
{
    QList<TimerInfo> list;
    for (const auto &t : timers) {
        if (t->obj == object)
            list.emplaceBack(TimerInfo{t->interval, t->id, t->timerType});
    }
    return list;
}